

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprCodeVector(Parse *pParse,Expr *p,int *piFreeable)

{
  int iVar1;
  int local_2c;
  int i;
  int nResult;
  int iResult;
  int *piFreeable_local;
  Expr *p_local;
  Parse *pParse_local;
  
  iVar1 = sqlite3ExprVectorSize(p);
  if (iVar1 == 1) {
    i = sqlite3ExprCodeTemp(pParse,p,piFreeable);
  }
  else {
    *piFreeable = 0;
    if (p->op == 0x83) {
      i = sqlite3CodeSubselect(pParse,p);
    }
    else {
      i = pParse->nMem + 1;
      pParse->nMem = iVar1 + pParse->nMem;
      for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
        sqlite3ExprCodeFactorable(pParse,((p->x).pList)->a[local_2c].pExpr,local_2c + i);
      }
    }
  }
  return i;
}

Assistant:

static int exprCodeVector(Parse *pParse, Expr *p, int *piFreeable){
  int iResult;
  int nResult = sqlite3ExprVectorSize(p);
  if( nResult==1 ){
    iResult = sqlite3ExprCodeTemp(pParse, p, piFreeable);
  }else{
    *piFreeable = 0;
    if( p->op==TK_SELECT ){
#if SQLITE_OMIT_SUBQUERY
      iResult = 0;
#else
      iResult = sqlite3CodeSubselect(pParse, p);
#endif
    }else{
      int i;
      iResult = pParse->nMem+1;
      pParse->nMem += nResult;
      for(i=0; i<nResult; i++){
        sqlite3ExprCodeFactorable(pParse, p->x.pList->a[i].pExpr, i+iResult);
      }
    }
  }
  return iResult;
}